

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::DriveStrengthSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,DriveStrengthSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  Token token_03;
  size_t index_local;
  DriveStrengthSyntax *this_local;
  
  switch(index) {
  case 0:
    token.kind = (this->openParen).kind;
    token._2_1_ = (this->openParen).field_0x2;
    token.numFlags.raw = (this->openParen).numFlags.raw;
    token.rawLen = (this->openParen).rawLen;
    token.info = (this->openParen).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 1:
    token_00.kind = (this->strength0).kind;
    token_00._2_1_ = (this->strength0).field_0x2;
    token_00.numFlags.raw = (this->strength0).numFlags.raw;
    token_00.rawLen = (this->strength0).rawLen;
    token_00.info = (this->strength0).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 2:
    token_01.kind = (this->comma).kind;
    token_01._2_1_ = (this->comma).field_0x2;
    token_01.numFlags.raw = (this->comma).numFlags.raw;
    token_01.rawLen = (this->comma).rawLen;
    token_01.info = (this->comma).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_01);
    break;
  case 3:
    token_02.kind = (this->strength1).kind;
    token_02._2_1_ = (this->strength1).field_0x2;
    token_02.numFlags.raw = (this->strength1).numFlags.raw;
    token_02.rawLen = (this->strength1).rawLen;
    token_02.info = (this->strength1).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_02);
    break;
  case 4:
    token_03.kind = (this->closeParen).kind;
    token_03._2_1_ = (this->closeParen).field_0x2;
    token_03.numFlags.raw = (this->closeParen).numFlags.raw;
    token_03.rawLen = (this->closeParen).rawLen;
    token_03.info = (this->closeParen).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_03);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax DriveStrengthSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return openParen;
        case 1: return strength0;
        case 2: return comma;
        case 3: return strength1;
        case 4: return closeParen;
        default: return nullptr;
    }
}